

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::columnCountChanged(QTableView *this,int param_1,int param_2)

{
  long lVar1;
  QHeaderView *this_00;
  ScrollMode SVar2;
  int visualSectionNumber;
  QScrollBar *this_01;
  undefined4 in_register_00000034;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x268))(this,CONCAT44(in_register_00000034,param_1));
  SVar2 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
  this_00 = *(QHeaderView **)(lVar1 + 0x580);
  this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
  visualSectionNumber = QAbstractSlider::value(&this_01->super_QAbstractSlider);
  if (SVar2 == ScrollPerItem) {
    QHeaderView::setOffsetToSectionPosition(this_00,visualSectionNumber);
  }
  else {
    QHeaderView::setOffset(this_00,visualSectionNumber);
  }
  QWidget::update(*(QWidget **)(lVar1 + 0x2b0));
  return;
}

Assistant:

void QTableView::columnCountChanged(int, int)
{
    Q_D(QTableView);
    updateGeometries();
    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem)
        d->horizontalHeader->setOffsetToSectionPosition(horizontalScrollBar()->value());
    else
        d->horizontalHeader->setOffset(horizontalScrollBar()->value());
    d->viewport->update();
}